

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O0

int __thiscall zmq::context_t::shutdown(context_t *this,int __fd,int __how)

{
  uint uVar1;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  int rc;
  context_t *this_local;
  
  if (this->ptr != (void *)0x0) {
    uVar1 = zmq_ctx_shutdown(this->ptr,CONCAT44(in_register_00000034,__fd),
                             CONCAT44(in_register_00000014,__how));
    this = (context_t *)(ulong)uVar1;
    if (uVar1 != 0) {
      __assert_fail("rc == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq.hpp",
                    0x379,"void zmq::context_t::shutdown()");
    }
  }
  return (int)this;
}

Assistant:

void shutdown() ZMQ_NOTHROW
    {
        if (ptr == ZMQ_NULLPTR)
            return;
        int rc = zmq_ctx_shutdown(ptr);
        ZMQ_ASSERT(rc == 0);
    }